

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateSSEImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateSSEImpl<double,_2,_0>::calcPartialsPartials
          (BeagleCPU4StateSSEImpl<double,_2,_0> *this,double *destP,double *partials_q,
          double *matrices_q,double *partials_r,double *matrices_r,int startPattern,int endPattern)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  long in_RCX;
  long in_RDX;
  double *in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  V_Real tmp_vpq_01;
  V_Real vpq_3;
  V_Real vpq_2;
  V_Real vpq_1;
  V_Real vpq_0;
  int k;
  int i;
  double *m2;
  double *m1;
  int l;
  V_Real *destPvec;
  VecUnion vu_mr [6] [2];
  VecUnion vu_mq [6] [2];
  V_Real destr_23;
  V_Real destr_01;
  V_Real destq_23;
  V_Real destq_01;
  int w;
  int v;
  int patternDefficit;
  int local_610;
  int local_60c;
  double *local_608;
  double *local_600;
  int local_5f4;
  double *local_5f0;
  double local_5e8 [56];
  int local_424;
  int local_420;
  V_Real tmp_vpr_23;
  V_Real tmp_vpr_01;
  V_Real vpr_3;
  V_Real vpr_2;
  V_Real vpr_1;
  V_Real vpr_0;
  V_Real tmp_vpq_23;
  
  iVar10 = (*(int *)(in_RDI + 0x14) + *(int *)(in_RDI + 0x1c)) - vpq_3[0]._0_4_;
  local_420 = 0;
  local_424 = 0;
  local_5f0 = in_RSI;
  for (local_5f4 = 0; local_5f4 < *(int *)(in_RDI + 0x34); local_5f4 = local_5f4 + 1) {
    local_5f0 = local_5f0 + (long)(tmp_vpq_01[1]._0_4_ << 1) * 2;
    local_420 = tmp_vpq_01[1]._0_4_ * 4 + local_420;
    local_600 = (double *)(in_RCX + (long)local_424 * 8);
    local_608 = (double *)(in_R9 + (long)local_424 * 8);
    for (local_60c = 0; local_60c < 6; local_60c = local_60c + 1) {
      local_5e8[(long)local_60c * 4 + 0x18] = *local_600;
      local_5e8[(long)local_60c * 4 + 0x19] = local_600[6];
      local_5e8[(long)local_60c * 4] = *local_608;
      local_5e8[(long)local_60c * 4 + 1] = local_608[6];
      local_5e8[(long)local_60c * 4 + 0x1a] = local_600[0xc];
      local_5e8[(long)local_60c * 4 + 0x1b] = local_600[0x12];
      local_5e8[(long)local_60c * 4 + 2] = local_608[0xc];
      local_5e8[(long)local_60c * 4 + 3] = local_608[0x12];
      local_600 = local_600 + 1;
      local_608 = local_608 + 1;
    }
    for (local_610 = tmp_vpq_01[1]._0_4_; local_610 < vpq_3[0]._0_4_; local_610 = local_610 + 1) {
      pdVar1 = (double *)(in_RDX + (long)local_420 * 8);
      dVar2 = *pdVar1;
      dVar3 = pdVar1[1];
      pdVar1 = (double *)(in_RDX + 0x10 + (long)local_420 * 8);
      dVar4 = *pdVar1;
      dVar5 = pdVar1[1];
      pdVar1 = (double *)(in_R8 + (long)local_420 * 8);
      dVar6 = *pdVar1;
      dVar7 = pdVar1[1];
      pdVar1 = (double *)(in_R8 + 0x10 + (long)local_420 * 8);
      dVar8 = *pdVar1;
      dVar9 = pdVar1[1];
      *local_5f0 = (dVar5 * local_5e8[0x24] +
                   dVar4 * local_5e8[0x20] + dVar3 * local_5e8[0x1c] + dVar2 * local_5e8[0x18]) *
                   (dVar9 * local_5e8[0xc] +
                   dVar8 * local_5e8[8] + dVar7 * local_5e8[4] + dVar6 * local_5e8[0]);
      local_5f0[1] = (dVar5 * local_5e8[0x25] +
                     dVar4 * local_5e8[0x21] + dVar3 * local_5e8[0x1d] + dVar2 * local_5e8[0x19]) *
                     (dVar9 * local_5e8[0xd] +
                     dVar8 * local_5e8[9] + dVar7 * local_5e8[5] + dVar6 * local_5e8[1]);
      local_5f0[2] = (dVar5 * local_5e8[0x26] +
                     dVar4 * local_5e8[0x22] + dVar3 * local_5e8[0x1e] + dVar2 * local_5e8[0x1a]) *
                     (dVar9 * local_5e8[0xe] +
                     dVar8 * local_5e8[10] + dVar7 * local_5e8[6] + dVar6 * local_5e8[2]);
      local_5f0[3] = (dVar5 * local_5e8[0x27] +
                     dVar4 * local_5e8[0x23] + dVar3 * local_5e8[0x1f] + dVar2 * local_5e8[0x1b]) *
                     (dVar9 * local_5e8[0xf] +
                     dVar8 * local_5e8[0xb] + dVar7 * local_5e8[7] + dVar6 * local_5e8[3]);
      local_5f0 = local_5f0 + 4;
      local_420 = local_420 + 4;
    }
    local_424 = local_424 + 0x18;
    if (*(int *)(in_RDI + 0x1c) != 0) {
      local_5f0 = local_5f0 + (long)(*(int *)(in_RDI + 0x1c) << 1) * 2;
      local_420 = *(int *)(in_RDI + 0x1c) * 4 + local_420;
    }
    local_5f0 = local_5f0 + (long)(iVar10 * 2) * 2;
    local_420 = iVar10 * 4 + local_420;
  }
  return;
}

Assistant:

BEAGLE_CPU_4_SSE_TEMPLATE
void BeagleCPU4StateSSEImpl<BEAGLE_CPU_4_SSE_DOUBLE>::calcPartialsPartials(double* destP,
                                                                           const double*  partials_q,
                                                                           const double*  matrices_q,
                                                                           const double*  partials_r,
                                                                           const double*  matrices_r,
                                                                           int startPattern,
                                                                           int endPattern) {

    int patternDefficit = kPatternCount + kExtraPatterns - endPattern;

    int v = 0;
    int w = 0;

    V_Real	destq_01, destq_23, destr_01, destr_23;
 	  VecUnion vu_mq[OFFSET][2], vu_mr[OFFSET][2];
	  V_Real *destPvec = (V_Real *)destP;

    for (int l = 0; l < kCategoryCount; l++) {
      destPvec += startPattern*2;
      v += startPattern*4;
		/* Load transition-probability matrices into vectors */
    	SSE_PREFETCH_MATRICES(matrices_q + w, matrices_r + w, vu_mq, vu_mr);

        for (int k = startPattern; k < endPattern; k++) {

#           if 1 && !defined(_WIN32)
            __builtin_prefetch (&partials_q[v+64]);
            __builtin_prefetch (&partials_r[v+64]);
//            __builtin_prefetch (destPvec+32,1,0);
#           endif

        	V_Real vpq_0, vpq_1, vpq_2, vpq_3;
        	SSE_PREFETCH_PARTIALS(vpq_,partials_q,v);

        	V_Real vpr_0, vpr_1, vpr_2, vpr_3;
        	SSE_PREFETCH_PARTIALS(vpr_,partials_r,v);

#			if 1	/* This would probably be faster on PPC/Altivec, which has a fused multiply-add
			           vector instruction */

			destq_01 = VEC_MULT(vpq_0, vu_mq[0][0].vx);
			destq_01 = VEC_MADD(vpq_1, vu_mq[1][0].vx, destq_01);
			destq_01 = VEC_MADD(vpq_2, vu_mq[2][0].vx, destq_01);
			destq_01 = VEC_MADD(vpq_3, vu_mq[3][0].vx, destq_01);
			destq_23 = VEC_MULT(vpq_0, vu_mq[0][1].vx);
			destq_23 = VEC_MADD(vpq_1, vu_mq[1][1].vx, destq_23);
			destq_23 = VEC_MADD(vpq_2, vu_mq[2][1].vx, destq_23);
			destq_23 = VEC_MADD(vpq_3, vu_mq[3][1].vx, destq_23);

			destr_01 = VEC_MULT(vpr_0, vu_mr[0][0].vx);
			destr_01 = VEC_MADD(vpr_1, vu_mr[1][0].vx, destr_01);
			destr_01 = VEC_MADD(vpr_2, vu_mr[2][0].vx, destr_01);
			destr_01 = VEC_MADD(vpr_3, vu_mr[3][0].vx, destr_01);
			destr_23 = VEC_MULT(vpr_0, vu_mr[0][1].vx);
			destr_23 = VEC_MADD(vpr_1, vu_mr[1][1].vx, destr_23);
			destr_23 = VEC_MADD(vpr_2, vu_mr[2][1].vx, destr_23);
			destr_23 = VEC_MADD(vpr_3, vu_mr[3][1].vx, destr_23);

#			else	/* SSE doesn't have a fused multiply-add, so a slight speed gain should be
                       achieved by decoupling these operations to avoid dependency stalls */

			V_Real a, b, c, d;

			a = VEC_MULT(vpq_0, vu_mq[0][0].vx);
			b = VEC_MULT(vpq_2, vu_mq[2][0].vx);
			c = VEC_MULT(vpq_0, vu_mq[0][1].vx);
			d = VEC_MULT(vpq_2, vu_mq[2][1].vx);
			a = VEC_MADD(vpq_1, vu_mq[1][0].vx, a);
			b = VEC_MADD(vpq_3, vu_mq[3][0].vx, b);
			c = VEC_MADD(vpq_1, vu_mq[1][1].vx, c);
			d = VEC_MADD(vpq_3, vu_mq[3][1].vx, d);
			destq_01 = VEC_ADD(a, b);
			destq_23 = VEC_ADD(c, d);

			a = VEC_MULT(vpr_0, vu_mr[0][0].vx);
			b = VEC_MULT(vpr_2, vu_mr[2][0].vx);
			c = VEC_MULT(vpr_0, vu_mr[0][1].vx);
			d = VEC_MULT(vpr_2, vu_mr[2][1].vx);
			a = VEC_MADD(vpr_1, vu_mr[1][0].vx, a);
			b = VEC_MADD(vpr_3, vu_mr[3][0].vx, b);
			c = VEC_MADD(vpr_1, vu_mr[1][1].vx, c);
			d = VEC_MADD(vpr_3, vu_mr[3][1].vx, d);
			destr_01 = VEC_ADD(a, b);
			destr_23 = VEC_ADD(c, d);

#			endif

#			if 1//
            destPvec[0] = VEC_MULT(destq_01, destr_01);
            destPvec[1] = VEC_MULT(destq_23, destr_23);
            destPvec += 2;

#			else	/* VEC_STORE did demonstrate a measurable performance gain as
					   it copies all (2/4) values to memory simultaneously;
					   I can no longer reproduce the performance gain (?) */

			VEC_STORE(destP + v + 0,VEC_MULT(destq_01, destr_01));
			VEC_STORE(destP + v + 2,VEC_MULT(destq_23, destr_23));

#			endif

            v += 4;
        }
        w += OFFSET*4;
        if (kExtraPatterns) {
        	destPvec += kExtraPatterns * 2;
        	v += kExtraPatterns * 4;
        }
        destPvec += patternDefficit * 2;
        v += patternDefficit * 4;
    }
}